

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O0

void Kit_TruthAndPhase(uint *pOut,uint *pIn0,uint *pIn1,int nVars,int fCompl0,int fCompl1)

{
  int local_30;
  int w;
  int fCompl1_local;
  int fCompl0_local;
  int nVars_local;
  uint *pIn1_local;
  uint *pIn0_local;
  uint *pOut_local;
  
  if ((fCompl0 == 0) || (fCompl1 == 0)) {
    if ((fCompl0 == 0) || (fCompl1 != 0)) {
      if ((fCompl0 == 0) && (fCompl1 != 0)) {
        local_30 = Kit_TruthWordNum(nVars);
        while (local_30 = local_30 + -1, -1 < local_30) {
          pOut[local_30] = pIn0[local_30] & (pIn1[local_30] ^ 0xffffffff);
        }
      }
      else {
        local_30 = Kit_TruthWordNum(nVars);
        while (local_30 = local_30 + -1, -1 < local_30) {
          pOut[local_30] = pIn0[local_30] & pIn1[local_30];
        }
      }
    }
    else {
      local_30 = Kit_TruthWordNum(nVars);
      while (local_30 = local_30 + -1, -1 < local_30) {
        pOut[local_30] = (pIn0[local_30] ^ 0xffffffff) & pIn1[local_30];
      }
    }
  }
  else {
    local_30 = Kit_TruthWordNum(nVars);
    while (local_30 = local_30 + -1, -1 < local_30) {
      pOut[local_30] = (pIn0[local_30] | pIn1[local_30]) ^ 0xffffffff;
    }
  }
  return;
}

Assistant:

static inline void Kit_TruthAndPhase( unsigned * pOut, unsigned * pIn0, unsigned * pIn1, int nVars, int fCompl0, int fCompl1 )
{
    int w;
    if ( fCompl0 && fCompl1 )
    {
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = ~(pIn0[w] | pIn1[w]);
    }
    else if ( fCompl0 && !fCompl1 )
    {
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = ~pIn0[w] & pIn1[w];
    }
    else if ( !fCompl0 && fCompl1 )
    {
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = pIn0[w] & ~pIn1[w];
    }
    else // if ( !fCompl0 && !fCompl1 )
    {
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = pIn0[w] & pIn1[w];
    }
}